

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

Variable * __thiscall TCV::getAvailableVar(TCV *this,string *nodeName)

{
  bool bVar1;
  mapped_type *ppCVar2;
  Function *this_00;
  Variable *pVVar3;
  
  if ((this->currentNamespace)._M_string_length == 0) {
    bVar1 = std::operator==(&this->currentFuncName,"main");
    if (bVar1) {
      this_00 = this->symbolTable->main;
    }
    else {
      this_00 = Semantic::SymbolTable::getFreeFunction
                          (this->symbolTable,&this->currentFuncName,this->currentFunction);
    }
  }
  else {
    ppCVar2 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)this->symbolTable,&this->currentNamespace);
    this_00 = Class::getFunction(*ppCVar2,&this->currentFuncName,this->currentFunction);
  }
  pVVar3 = Function::getVariable(this_00,nodeName);
  return pVVar3;
}

Assistant:

const Variable *TCV::getAvailableVar(std::string &nodeName) const {
    const Variable *variable;
    if (currentNamespace.empty()) {
        if (currentFuncName == "main")
            variable = symbolTable->main->getVariable(nodeName);
        else
            variable = symbolTable->getFreeFunction(currentFuncName, currentFunction)->getVariable(nodeName);
    } else {
        auto _class = symbolTable->classes.at(currentNamespace);
        variable = _class->getFunction(currentFuncName, currentFunction)->getVariable(nodeName);
    }
    return variable;
}